

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O1

int Cba_ReadHexDigit(char HexChar)

{
  int iVar1;
  
  iVar1 = -0x30;
  if ((9 < (byte)(HexChar - 0x30U)) && (iVar1 = -0x37, 5 < (byte)(HexChar + 0xbfU))) {
    iVar1 = -0x57;
    if (5 < (byte)(HexChar + 0x9fU)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaBlast.c"
                    ,0x4a,"int Cba_ReadHexDigit(char)");
    }
  }
  return HexChar + iVar1;
}

Assistant:

int Cba_ReadHexDigit( char HexChar )
{
    if ( HexChar >= '0' && HexChar <= '9' )
        return HexChar - '0';
    if ( HexChar >= 'A' && HexChar <= 'F' )
        return HexChar - 'A' + 10;
    if ( HexChar >= 'a' && HexChar <= 'f' )
        return HexChar - 'a' + 10;
    assert( 0 ); // not a hexadecimal symbol
    return -1; // return value which makes no sense
}